

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O2

void __thiscall Web_Constraint::Constraint_Removed(Web_Constraint *this,Am_Slot *removing_slot)

{
  Output_Port *ptr;
  bool bVar1;
  Output_Port **ppOVar2;
  Output_Port **ppOVar3;
  Output_Port *pOVar4;
  Am_Web_Data *this_00;
  
  ppOVar2 = &this->owner->out_list;
  pOVar4 = (Output_Port *)0x0;
  ppOVar3 = ppOVar2;
  while( true ) {
    ptr = *ppOVar3;
    if (ptr == (Output_Port *)0x0) {
      return;
    }
    if ((ptr->context).data == removing_slot->data) break;
    ppOVar3 = &ptr->next;
    pOVar4 = ptr;
  }
  ppOVar3 = &pOVar4->next;
  if (pOVar4 == (Output_Port *)0x0) {
    ppOVar3 = ppOVar2;
  }
  *ppOVar3 = ptr->next;
  ptr->next = (Output_Port *)0x0;
  Output_Port::operator_delete(ptr,0x10);
  this_00 = this->owner;
  if (this_00->create_proc != (Am_Web_Create_Proc *)0x0) {
    bVar1 = (*this_00->create_proc)(removing_slot);
    this_00 = this->owner;
    if (bVar1) {
      if (this_00->in_list != (Input_Port *)0x0) {
        Input_Port::Destroy(this_00->in_list,&this->super_Am_Constraint);
        this_00 = this->owner;
        this_00->in_list = (Input_Port *)0x0;
      }
      if (this_00->out_list != (Output_Port *)0x0) {
        Output_Port::Destroy(this_00->out_list,&this->super_Am_Constraint);
        this_00 = this->owner;
        this_00->out_list = (Output_Port *)0x0;
      }
    }
  }
  if (this_00->in_list != (Input_Port *)0x0) {
    return;
  }
  if (this_00->out_list != (Output_Port *)0x0) {
    return;
  }
  Am_Web_Data::~Am_Web_Data(this_00);
  operator_delete(this_00);
  return;
}

Assistant:

void
Web_Constraint::Constraint_Removed(const Am_Slot &removing_slot)
{
  Output_Port *prev = nullptr;
  Output_Port *curr = owner->out_list;
  while (curr) {
    if (curr->context == removing_slot) {
      if (prev)
        prev->next = curr->next;
      else
        owner->out_list = curr->next;
      curr->next = nullptr;
      delete curr;
      if (owner->create_proc && owner->create_proc(removing_slot)) {
        if (owner->in_list) {
          owner->in_list->Destroy(this);
          owner->in_list = nullptr;
        }
        if (owner->out_list) {
          owner->out_list->Destroy(this);
          owner->out_list = nullptr;
        }
      }
      if (!owner->in_list && !owner->out_list)
        delete owner;
      break;
    }
    prev = curr;
    curr = curr->next;
  }
}